

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdef_block_simd.h
# Opt level: O3

int cdef_find_dir_avx2(uint16_t *img,int stride,int32_t *var,int coeff_shift)

{
  uint uVar1;
  ushort uVar2;
  long lVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  v128 tmp;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  v128 tmp_1;
  undefined1 auVar18 [16];
  int32_t cost [8];
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  undefined1 local_38 [16];
  undefined1 local_28 [16];
  undefined1 local_18 [16];
  
  lVar3 = 0;
  auVar8._8_2_ = 0xff80;
  auVar8._0_8_ = 0xff80ff80ff80ff80;
  auVar8._10_2_ = 0xff80;
  auVar8._12_2_ = 0xff80;
  auVar8._14_2_ = 0xff80;
  do {
    auVar9 = vlddqu_avx(*(undefined1 (*) [16])img);
    auVar9 = vpsraw_avx(auVar9,ZEXT416((uint)coeff_shift));
    auVar9 = vpaddw_avx(auVar9,auVar8);
    *(undefined1 (*) [16])(local_a8 + lVar3) = auVar9;
    img = (uint16_t *)(*(undefined1 (*) [16])img + (long)stride * 2);
    lVar3 = lVar3 + 0x10;
  } while (lVar3 != 0x80);
  auVar8 = vpslldq_avx(local_a8,0xe);
  auVar9 = vpsrldq_avx(local_a8,2);
  auVar11 = vpslldq_avx(local_98,0xc);
  auVar8 = vpaddw_avx(auVar11,auVar8);
  auVar11 = vpsrldq_avx(local_98,4);
  auVar9 = vpaddw_avx(auVar11,auVar9);
  auVar11 = vpaddw_avx(local_98,local_a8);
  auVar5 = vpslldq_avx(local_88,10);
  auVar7 = vpsrldq_avx(local_88,6);
  auVar12 = vpslldq_avx(local_78,8);
  auVar5 = vpaddw_avx(auVar5,auVar12);
  auVar8 = vpaddw_avx(auVar8,auVar5);
  auVar5 = vpsrldq_avx(local_78,8);
  auVar5 = vpaddw_avx(auVar7,auVar5);
  auVar9 = vpaddw_avx(auVar9,auVar5);
  auVar5 = vpaddw_avx(local_78,local_88);
  auVar7 = vpslldq_avx(auVar11,10);
  auVar12 = vpslldq_avx(auVar5,8);
  auVar7 = vpaddw_avx(auVar12,auVar7);
  auVar12 = vpslldq_avx(auVar11,4);
  auVar10 = vpslldq_avx(auVar5,6);
  auVar12 = vpaddw_avx(auVar10,auVar12);
  auVar10 = vpaddw_avx(auVar5,auVar11);
  auVar14 = vpslldq_avx(local_68,6);
  auVar15 = vpsrldq_avx(local_68,10);
  auVar17 = vpslldq_avx(local_58,4);
  auVar14 = vpaddw_avx(auVar14,auVar17);
  auVar17 = vpsrldq_avx(local_58,0xc);
  auVar15 = vpaddw_avx(auVar15,auVar17);
  auVar17 = vpaddw_avx(local_58,local_68);
  auVar13 = vpslldq_avx(auVar17,6);
  auVar6 = vpslldq_avx(auVar17,8);
  auVar18 = vpslldq_avx(local_48,2);
  auVar16 = vpsrldq_avx(local_48,0xe);
  auVar15 = vpaddw_avx(auVar15,auVar16);
  auVar9 = vpaddw_avx(auVar15,auVar9);
  auVar14 = vpaddw_avx(auVar14,local_38);
  auVar8 = vpaddw_avx(auVar8,auVar14);
  auVar8 = vpaddw_avx(auVar8,auVar18);
  auVar14 = vpaddw_avx(local_38,local_48);
  auVar15 = vpslldq_avx(auVar14,4);
  auVar15 = vpaddw_avx(auVar15,auVar13);
  auVar7 = vpaddw_avx(auVar7,auVar15);
  auVar15 = vpslldq_avx(auVar14,10);
  auVar15 = vpaddw_avx(auVar6,auVar15);
  auVar12 = vpaddw_avx(auVar12,auVar15);
  auVar15 = vpaddw_avx(auVar17,auVar14);
  auVar10 = vpaddw_avx(auVar10,auVar15);
  auVar9 = vpshufb_avx(auVar9,_DAT_005668e0);
  auVar15 = vpunpcklwd_avx(auVar8,auVar9);
  auVar9 = vpunpckhwd_avx(auVar8,auVar9);
  auVar8 = vpmaddwd_avx(auVar15,auVar15);
  auVar9 = vpmaddwd_avx(auVar9,auVar9);
  auVar8 = vpmulld_avx(auVar8,_DAT_005668f0);
  auVar9 = vpmulld_avx(auVar9,_DAT_00566900);
  auVar15 = vpaddd_avx(auVar9,auVar8);
  auVar8 = vpblendd_avx2((undefined1  [16])0x0,auVar11,8);
  auVar9 = vpshufhw_avx(auVar8,0x6c);
  auVar8 = vpblendw_avx((undefined1  [16])0x0,auVar5,0xe0);
  auVar8 = vpshufhw_avx(auVar8,0x1b);
  auVar8 = vpaddw_avx(auVar8,auVar9);
  auVar9 = vpshufb_avx(auVar17,_DAT_00566910);
  auVar6 = vpshufb_avx(auVar14,_DAT_00566920);
  auVar9 = vpaddw_avx(auVar9,auVar6);
  auVar8 = vpaddw_avx(auVar8,auVar9);
  auVar6 = vpunpcklwd_avx(auVar12,auVar8);
  auVar9 = vpunpckhwd_avx(auVar12,auVar8);
  auVar8 = vpmaddwd_avx(auVar6,auVar6);
  auVar9 = vpmaddwd_avx(auVar9,auVar9);
  auVar12 = vpmovsxwd_avx(ZEXT816(0xd201a400000000));
  auVar8 = vpmulld_avx(auVar8,auVar12);
  auVar6 = vpmovzxbd_avx(ZEXT416(0x6969698c));
  auVar9 = vpmulld_avx(auVar9,auVar6);
  auVar9 = vpaddd_avx(auVar9,auVar8);
  auVar8 = vpshufb_avx(auVar11,_DAT_00566920);
  auVar11 = vpshufb_avx(auVar5,_DAT_00566910);
  auVar8 = vpaddw_avx(auVar11,auVar8);
  auVar11 = vpblendw_avx((undefined1  [16])0x0,auVar17,0xe0);
  auVar11 = vpshufhw_avx(auVar11,0x1b);
  auVar8 = vpaddw_avx(auVar8,auVar11);
  auVar11 = vpblendd_avx2((undefined1  [16])0x0,auVar14,8);
  auVar11 = vpshufhw_avx(auVar11,0x6c);
  auVar8 = vpaddw_avx(auVar8,auVar11);
  auVar5 = vpunpcklwd_avx(auVar7,auVar8);
  auVar11 = vpunpckhwd_avx(auVar7,auVar8);
  auVar8 = vpmaddwd_avx(auVar5,auVar5);
  auVar11 = vpmaddwd_avx(auVar11,auVar11);
  auVar8 = vpmulld_avx(auVar8,auVar12);
  auVar11 = vpmulld_avx(auVar11,auVar6);
  auVar8 = vpaddd_avx(auVar11,auVar8);
  auVar11 = vpmaddwd_avx(auVar10,auVar10);
  auVar18._8_4_ = 0x69;
  auVar18._0_8_ = 0x6900000069;
  auVar18._12_4_ = 0x69;
  auVar11 = vpmulld_avx(auVar11,auVar18);
  auVar7 = vpunpckldq_avx(auVar15,auVar8);
  auVar5 = vpunpckhdq_avx(auVar15,auVar8);
  auVar8 = vpunpckldq_avx(auVar11,auVar9);
  auVar9 = vpunpckhdq_avx(auVar11,auVar9);
  auVar11 = vpunpcklqdq_avx(auVar7,auVar8);
  auVar8 = vpunpckhqdq_avx(auVar7,auVar8);
  auVar8 = vpaddd_avx(auVar11,auVar8);
  auVar11 = vpunpcklqdq_avx(auVar5,auVar9);
  auVar9 = vpunpckhqdq_avx(auVar5,auVar9);
  auVar9 = vpaddd_avx(auVar9,auVar11);
  local_18 = vpaddd_avx(auVar8,auVar9);
  auVar7 = vpunpcklwd_avx(local_a8,local_98);
  auVar8 = vpunpckhwd_avx(local_a8,local_98);
  auVar12 = vpunpcklwd_avx(local_88,local_78);
  auVar9 = vpunpckhwd_avx(local_88,local_78);
  auVar14 = vpunpcklwd_avx(local_68,local_58);
  auVar11 = vpunpckhwd_avx(local_68,local_58);
  auVar15 = vpunpcklwd_avx(local_48,local_38);
  auVar5 = vpunpckhwd_avx(local_48,local_38);
  auVar17 = vpunpckldq_avx(auVar7,auVar12);
  auVar10 = vpunpckhdq_avx(auVar7,auVar12);
  auVar7 = vpunpckldq_avx(auVar14,auVar15);
  auVar14 = vpunpckhdq_avx(auVar14,auVar15);
  auVar12 = vpunpckldq_avx(auVar8,auVar9);
  auVar8 = vpunpckhdq_avx(auVar8,auVar9);
  auVar15 = vpunpckldq_avx(auVar11,auVar5);
  auVar9 = vpunpckhdq_avx(auVar11,auVar5);
  auVar6 = vpunpcklqdq_avx(auVar17,auVar7);
  auVar17 = vpunpckhqdq_avx(auVar17,auVar7);
  auVar5 = vpunpcklqdq_avx(auVar8,auVar9);
  auVar11 = vpunpckhqdq_avx(auVar8,auVar9);
  auVar8 = vpslldq_avx(auVar8,0xc);
  auVar9 = vpslldq_avx(auVar11,0xe);
  auVar8 = vpaddw_avx(auVar9,auVar8);
  auVar9 = vpsrldq_avx(auVar11,2);
  auVar7 = vpsrldq_avx(auVar5,4);
  auVar9 = vpaddw_avx(auVar7,auVar9);
  auVar11 = vpaddw_avx(auVar5,auVar11);
  auVar13 = vpunpcklqdq_avx(auVar12,auVar15);
  auVar7 = vpunpckhqdq_avx(auVar12,auVar15);
  auVar5 = vpslldq_avx(auVar12,8);
  auVar12 = vpslldq_avx(auVar7,10);
  auVar5 = vpaddw_avx(auVar12,auVar5);
  auVar8 = vpaddw_avx(auVar5,auVar8);
  auVar5 = vpsrldq_avx(auVar7,6);
  auVar12 = vpsrldq_avx(auVar13,8);
  auVar5 = vpaddw_avx(auVar5,auVar12);
  auVar9 = vpaddw_avx(auVar9,auVar5);
  auVar5 = vpaddw_avx(auVar13,auVar7);
  auVar7 = vpslldq_avx(auVar11,10);
  auVar12 = vpslldq_avx(auVar5,8);
  auVar7 = vpaddw_avx(auVar12,auVar7);
  auVar12 = vpslldq_avx(auVar11,4);
  auVar15 = vpslldq_avx(auVar5,6);
  auVar12 = vpaddw_avx(auVar15,auVar12);
  auVar13 = vpunpcklqdq_avx(auVar10,auVar14);
  auVar15 = vpunpckhqdq_avx(auVar10,auVar14);
  auVar10 = vpslldq_avx(auVar15,6);
  auVar16 = vpslldq_avx(auVar13,4);
  auVar10 = vpaddw_avx(auVar10,auVar16);
  auVar14 = vpsrldq_avx(auVar14,10);
  auVar16 = vpsrldq_avx(auVar13,0xc);
  auVar14 = vpaddw_avx(auVar16,auVar14);
  auVar15 = vpaddw_avx(auVar13,auVar15);
  auVar13 = vpsrldq_avx(auVar17,0xe);
  auVar14 = vpaddw_avx(auVar13,auVar14);
  auVar9 = vpaddw_avx(auVar9,auVar14);
  auVar10 = vpaddw_avx(auVar6,auVar10);
  auVar8 = vpaddw_avx(auVar8,auVar10);
  auVar10 = vpslldq_avx(auVar17,2);
  auVar8 = vpaddw_avx(auVar8,auVar10);
  auVar10 = vpaddw_avx(auVar6,auVar17);
  auVar14 = vpslldq_avx(auVar15,6);
  auVar17 = vpslldq_avx(auVar10,4);
  auVar14 = vpaddw_avx(auVar17,auVar14);
  auVar7 = vpaddw_avx(auVar7,auVar14);
  auVar14 = vpslldq_avx(auVar15,8);
  auVar17 = vpslldq_avx(auVar10,10);
  auVar14 = vpaddw_avx(auVar14,auVar17);
  auVar12 = vpaddw_avx(auVar12,auVar14);
  auVar14 = vpaddw_avx(auVar5,auVar11);
  auVar17 = vpaddw_avx(auVar15,auVar10);
  auVar14 = vpaddw_avx(auVar14,auVar17);
  auVar9 = vpshufb_avx(auVar9,_DAT_005668e0);
  auVar6 = vpunpcklwd_avx(auVar8,auVar9);
  auVar17 = vpunpckhwd_avx(auVar8,auVar9);
  auVar8 = vpmaddwd_avx(auVar6,auVar6);
  auVar9 = vpmulld_avx(auVar8,_DAT_005668f0);
  auVar8 = vpmaddwd_avx(auVar17,auVar17);
  auVar8 = vpmulld_avx(auVar8,_DAT_00566900);
  auVar17 = vpaddd_avx(auVar8,auVar9);
  auVar8 = vpblendd_avx2((undefined1  [16])0x0,auVar11,8);
  auVar9 = vpshufhw_avx(auVar8,0x6c);
  auVar8 = vpblendw_avx((undefined1  [16])0x0,auVar5,0xe0);
  auVar8 = vpshufhw_avx(auVar8,0x1b);
  auVar8 = vpaddw_avx(auVar8,auVar9);
  auVar9 = vpshufb_avx(auVar15,_DAT_00566910);
  auVar6 = vpshufb_avx(auVar10,_DAT_00566920);
  auVar9 = vpaddw_avx(auVar9,auVar6);
  auVar8 = vpaddw_avx(auVar8,auVar9);
  auVar6 = vpunpcklwd_avx(auVar12,auVar8);
  auVar9 = vpunpckhwd_avx(auVar12,auVar8);
  auVar8 = vpmaddwd_avx(auVar6,auVar6);
  auVar9 = vpmaddwd_avx(auVar9,auVar9);
  auVar12 = vpmovsxwd_avx(ZEXT816(0xd201a400000000));
  auVar8 = vpmulld_avx(auVar8,auVar12);
  auVar6 = vpmovzxbd_avx(ZEXT416(0x6969698c));
  auVar9 = vpmulld_avx(auVar9,auVar6);
  auVar9 = vpaddd_avx(auVar9,auVar8);
  auVar8 = vpshufb_avx(auVar11,_DAT_00566920);
  auVar11 = vpshufb_avx(auVar5,_DAT_00566910);
  auVar8 = vpaddw_avx(auVar11,auVar8);
  auVar11 = vpblendw_avx((undefined1  [16])0x0,auVar15,0xe0);
  auVar11 = vpshufhw_avx(auVar11,0x1b);
  auVar8 = vpaddw_avx(auVar8,auVar11);
  auVar11 = vpblendd_avx2((undefined1  [16])0x0,auVar10,8);
  auVar11 = vpshufhw_avx(auVar11,0x6c);
  auVar8 = vpaddw_avx(auVar8,auVar11);
  auVar11 = vpunpcklwd_avx(auVar7,auVar8);
  auVar5 = vpunpckhwd_avx(auVar7,auVar8);
  auVar8 = vpmaddwd_avx(auVar11,auVar11);
  auVar11 = vpmulld_avx(auVar8,auVar12);
  auVar8 = vpmaddwd_avx(auVar5,auVar5);
  auVar8 = vpmulld_avx(auVar8,auVar6);
  auVar8 = vpaddd_avx(auVar8,auVar11);
  auVar11 = vpmaddwd_avx(auVar14,auVar14);
  auVar11 = vpmulld_avx(auVar11,auVar18);
  auVar7 = vpunpckldq_avx(auVar17,auVar8);
  auVar5 = vpunpckhdq_avx(auVar17,auVar8);
  auVar8 = vpunpckldq_avx(auVar11,auVar9);
  auVar9 = vpunpckhdq_avx(auVar11,auVar9);
  auVar11 = vpunpcklqdq_avx(auVar7,auVar8);
  auVar8 = vpunpckhqdq_avx(auVar7,auVar8);
  auVar8 = vpaddd_avx(auVar11,auVar8);
  auVar11 = vpunpcklqdq_avx(auVar5,auVar9);
  auVar9 = vpunpckhqdq_avx(auVar5,auVar9);
  auVar9 = vpaddd_avx(auVar9,auVar11);
  local_28 = vpaddd_avx(auVar8,auVar9);
  auVar8 = vpmaxsd_avx(local_28,local_18);
  auVar9 = vpshufd_avx(auVar8,0x4e);
  auVar8 = vpmaxsd_avx(auVar8,auVar9);
  auVar9 = vpshufd_avx(auVar8,0x39);
  auVar11 = vpmaxsd_avx(auVar8,auVar9);
  auVar8 = vpcmpeqd_avx(auVar11,local_18);
  auVar9 = vpcmpeqd_avx(auVar11,local_28);
  auVar8 = vpackssdw_avx(auVar9,auVar8);
  auVar8 = vpacksswb_avx(auVar8,auVar8);
  uVar2 = (ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
          (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 | (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3
          | (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
          (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 | (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6
          | (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
          (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 | (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9
          | (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
          (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
          (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
          (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
          (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(byte)(auVar8[0xf] >> 7) << 0xf;
  uVar4 = uVar2 - 1 ^ (uint)uVar2;
  uVar1 = 0x1f;
  if (uVar4 != 0) {
    for (; uVar4 >> uVar1 == 0; uVar1 = uVar1 - 1) {
    }
  }
  *var = auVar11._0_4_ - *(int *)(local_28 + (ulong)(uVar1 & 7 ^ 4) * 4) >> 10;
  return uVar1;
}

Assistant:

int SIMD_FUNC(cdef_find_dir)(const uint16_t *img, int stride, int32_t *var,
                             int coeff_shift) {
  int i;
  int32_t cost[8];
  int32_t best_cost = 0;
  int best_dir = 0;
  v128 lines[8];
  for (i = 0; i < 8; i++) {
    lines[i] = v128_load_unaligned(&img[i * stride]);
    lines[i] =
        v128_sub_16(v128_shr_s16(lines[i], coeff_shift), v128_dup_16(128));
  }

  /* Compute "mostly vertical" directions. */
  v128 dir47 = compute_directions(lines, cost + 4);

  array_reverse_transpose_8x8(lines, lines);

  /* Compute "mostly horizontal" directions. */
  v128 dir03 = compute_directions(lines, cost);

  v128 max = v128_max_s32(dir03, dir47);
  max = v128_max_s32(max, v128_align(max, max, 8));
  max = v128_max_s32(max, v128_align(max, max, 4));
  best_cost = v128_low_u32(max);
  v128 t =
      v128_pack_s32_s16(v128_cmpeq_32(max, dir47), v128_cmpeq_32(max, dir03));
  best_dir = v128_movemask_8(v128_pack_s16_s8(t, t));
  best_dir = get_msb(best_dir ^ (best_dir - 1));  // Count trailing zeros

  /* Difference between the optimal variance and the variance along the
     orthogonal direction. Again, the sum(x^2) terms cancel out. */
  *var = best_cost - cost[(best_dir + 4) & 7];
  /* We'd normally divide by 840, but dividing by 1024 is close enough
     for what we're going to do with this. */
  *var >>= 10;
  return best_dir;
}